

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O2

SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
operator%(int lhs,SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                  rhs)

{
  bool bVar1;
  ulong in_RAX;
  undefined8 local_18;
  
  local_18 = in_RAX & 0xffffffff00000000;
  bVar1 = ModulusSimpleCaseHelper<int,_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>,_1>
          ::ModulusSimpleCase(lhs,rhs,(SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                                       *)&local_18);
  if (!bVar1) {
    local_18 = CONCAT44(lhs,local_18._0_4_);
    local_18._0_4_ =
         SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
         operator%((SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
                    *)((long)&local_18 + 4),rhs.m_int);
  }
  return (SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>)
         local_18._0_4_;
}

Assistant:

SAFEINT_CONSTEXPR14 SafeInt< T, E > operator %( U lhs, SafeInt< T, E > rhs ) SAFEINT_CPP_THROW
{
    // Value of return depends on sign of lhs
    // This one may not be safe - bounds check in constructor
    // if lhs is negative and rhs is unsigned, this will throw an exception.

    // Fast-track the simple case
    // same size and same sign
    SafeInt< T, E > result;

    if( ModulusSimpleCaseHelper< T, U, E, (sizeof(T) == sizeof(U)) && ((bool)std::numeric_limits< T >::is_signed == (bool)std::numeric_limits< U >::is_signed) >::ModulusSimpleCase( lhs, rhs, result ) )
        return result;

    result = (SafeInt< U, E >(lhs) % (T)rhs);
    return result;
}